

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O0

ASTContext * __thiscall
slang::ast::DeclaredType::getASTContext<false,slang::ast::ASTContext>(DeclaredType *this)

{
  LookupLocation lookupLocation;
  bool bVar1;
  Symbol *pSVar2;
  Scope *scope_;
  undefined8 *in_RSI;
  ASTContext *in_RDI;
  LookupLocation LVar3;
  LookupLocation location;
  InstanceSymbol *inst;
  InstanceBodySymbol *instBody;
  Scope *scope;
  bitmask<slang::ast::ASTFlags> astFlags;
  bitmask<slang::ast::DeclaredTypeFlags> *in_stack_fffffffffffffe88;
  Symbol *in_stack_fffffffffffffe90;
  ASTContext *this_00;
  bitmask<slang::ast::ASTFlags> flags;
  Scope *pSVar4;
  undefined8 *puVar5;
  LookupLocation local_e8;
  LookupLocation local_d8;
  underlying_type local_c8;
  Scope *local_c0;
  uint32_t local_b8;
  Scope *local_b0;
  uint32_t local_a8;
  bitmask<slang::ast::ASTFlags> local_a0;
  bitmask<slang::ast::InstanceFlags> local_91;
  InstanceSymbol *local_90;
  InstanceBodySymbol *local_88;
  bitmask<slang::ast::DeclaredTypeFlags> local_7c;
  bitmask<slang::ast::ASTFlags> local_78;
  bitmask<slang::ast::ASTFlags> local_70;
  Scope *local_68;
  bitmask<slang::ast::ASTFlags> local_60;
  bitmask<slang::ast::DeclaredTypeFlags> local_54;
  bitmask<slang::ast::ASTFlags> local_50;
  bitmask<slang::ast::DeclaredTypeFlags> local_44;
  bitmask<slang::ast::ASTFlags> local_40;
  bitmask<slang::ast::DeclaredTypeFlags> local_34;
  bitmask<slang::ast::ASTFlags> local_30;
  bitmask<slang::ast::DeclaredTypeFlags> local_24;
  bitmask<slang::ast::ASTFlags> local_20;
  bitmask<slang::ast::DeclaredTypeFlags> local_14;
  bitmask<slang::ast::ASTFlags> local_10 [2];
  
  bitmask<slang::ast::ASTFlags>::bitmask(local_10);
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_14,NetType);
  bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has
                    ((bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffe90,
                     in_stack_fffffffffffffe88);
  if (bVar1) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_20,NonProcedural);
    bitmask<slang::ast::ASTFlags>::operator|=(local_10,&local_20);
  }
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_24,AutomaticInitializer);
  bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has
                    ((bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffe90,
                     in_stack_fffffffffffffe88);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_30,StaticInitializer);
    bitmask<slang::ast::ASTFlags>::operator|=(local_10,&local_30);
  }
  puVar5 = in_RSI + 7;
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_34,CoverageType);
  bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has
                    ((bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffe90,
                     in_stack_fffffffffffffe88);
  if (bVar1) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_40,AllowCoverageSampleFormal);
    bitmask<slang::ast::ASTFlags>::operator|=(local_10,&local_40);
  }
  pSVar4 = (Scope *)(in_RSI + 7);
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_44,UserDefinedNetType);
  bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has
                    ((bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffe90,
                     in_stack_fffffffffffffe88);
  if (bVar1) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_50,AllowNetType);
    bitmask<slang::ast::ASTFlags>::operator|=(local_10,&local_50);
  }
  flags.m_bits = (underlying_type)(in_RSI + 7);
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_54,DPIArg);
  bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has
                    ((bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffe90,
                     in_stack_fffffffffffffe88);
  if (bVar1) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_60,DPIArg);
    bitmask<slang::ast::ASTFlags>::operator|=(local_10,&local_60);
  }
  local_68 = Symbol::getParentScope((Symbol *)*in_RSI);
  if (*(int *)*in_RSI == 0x4a) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_70,SpecparamInitializer);
    bitmask<slang::ast::ASTFlags>::operator|=(local_10,&local_70);
    pSVar2 = Scope::asSymbol(local_68);
    if (pSVar2->kind == SpecifyBlock) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_78,SpecifyBlock);
      bitmask<slang::ast::ASTFlags>::operator|=(local_10,&local_78);
    }
  }
  this_00 = (ASTContext *)(in_RSI + 7);
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_7c,TypeOverridden);
  bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has
                    ((bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffe90,
                     in_stack_fffffffffffffe88);
  if (bVar1) {
    Scope::asSymbol(local_68);
    local_88 = Symbol::as<slang::ast::InstanceBodySymbol>((Symbol *)0x55e2b5);
    local_90 = local_88->parentInstance;
    local_68 = Symbol::getParentScope((Symbol *)local_90);
    pSVar2 = (Symbol *)&local_88->flags;
    bitmask<slang::ast::InstanceFlags>::bitmask(&local_91,FromBind);
    bVar1 = bitmask<slang::ast::InstanceFlags>::has
                      ((bitmask<slang::ast::InstanceFlags> *)pSVar2,
                       (bitmask<slang::ast::InstanceFlags> *)in_stack_fffffffffffffe88);
    if (bVar1) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_a0,BindInstantiation);
      bitmask<slang::ast::ASTFlags>::operator|=(local_10,&local_a0);
    }
    LVar3 = LookupLocation::before(pSVar2);
    local_c0 = LVar3.scope;
    local_b8 = LVar3.index;
    local_c8 = local_10[0].m_bits;
    LVar3._8_8_ = puVar5;
    LVar3.scope = pSVar4;
    local_b0 = local_c0;
    local_a8 = local_b8;
    ASTContext::ASTContext(this_00,(Scope *)pSVar2,LVar3,flags);
  }
  else {
    LookupLocation::LookupLocation(&local_d8);
    if ((*(uint *)((long)in_RSI + 0x3c) & 0x3fffffff) == 0) {
      LVar3 = LookupLocation::before(in_stack_fffffffffffffe90);
      local_d8.scope = LVar3.scope;
      local_d8.index = LVar3.index;
    }
    else {
      scope_ = Symbol::getParentScope((Symbol *)*in_RSI);
      LookupLocation::LookupLocation(&local_e8,scope_,*(uint *)((long)in_RSI + 0x3c) & 0x3fffffff);
      local_d8.scope = local_e8.scope;
      local_d8.index = local_e8.index;
    }
    lookupLocation._8_8_ = puVar5;
    lookupLocation.scope = pSVar4;
    ASTContext::ASTContext(this_00,(Scope *)in_stack_fffffffffffffe90,lookupLocation,flags);
  }
  return in_RDI;
}

Assistant:

T DeclaredType::getASTContext() const {
    bitmask<ASTFlags> astFlags;
    if (flags.has(DeclaredTypeFlags::NetType))
        astFlags |= ASTFlags::NonProcedural;
    if (!flags.has(DeclaredTypeFlags::AutomaticInitializer))
        astFlags |= ASTFlags::StaticInitializer;
    if (flags.has(DeclaredTypeFlags::CoverageType))
        astFlags |= ASTFlags::AllowCoverageSampleFormal;
    if (flags.has(DeclaredTypeFlags::UserDefinedNetType))
        astFlags |= ASTFlags::AllowNetType;
    if (flags.has(DeclaredTypeFlags::DPIArg))
        astFlags |= ASTFlags::DPIArg;

    const Scope* scope = parent.getParentScope();
    SLANG_ASSERT(scope);

    // Specparams inside of specify blocks have additional constraints so we
    // need to set the AST flag for them.
    if (parent.kind == SymbolKind::Specparam) {
        astFlags |= ASTFlags::SpecparamInitializer;
        if (scope->asSymbol().kind == SymbolKind::SpecifyBlock)
            astFlags |= ASTFlags::SpecifyBlock;
    }

    // If this type/initializer has been overridden by a parameter override,
    // we should use the instantiation scope and not the parameter's scope
    // when resolving.
    if ((IsInitializer && flags.has(DeclaredTypeFlags::InitializerOverridden)) ||
        (!IsInitializer && flags.has(DeclaredTypeFlags::TypeOverridden))) {
        auto& instBody = scope->asSymbol().as<InstanceBodySymbol>();
        auto inst = instBody.parentInstance;
        SLANG_ASSERT(inst);

        scope = inst->getParentScope();
        SLANG_ASSERT(scope);

        if (instBody.flags.has(InstanceFlags::FromBind))
            astFlags |= ASTFlags::BindInstantiation;

        return ASTContext(*scope, LookupLocation::before(*inst), astFlags);
    }

    // The location depends on whether we are creating the initializer or the type.
    // Initializer lookup happens *after* the parent symbol, so that it can reference
    // the symbol itself. Type lookup happens *before*, since it can't yet see the
    // symbol declaration. There is an exception for parameters, which also can't
    // see its own declaration (which would result in infinite recursion).
    LookupLocation location;
    if (overrideIndex) {
        location = LookupLocation(parent.getParentScope(), overrideIndex);
    }
    else if (IsInitializer) {
        if (flags.has(DeclaredTypeFlags::InitializerCantSeeParent))
            location = LookupLocation::before(parent);
        else
            location = LookupLocation::after(parent);
    }
    else {
        location = LookupLocation::before(parent);
    }

    return ASTContext(*scope, location, astFlags);
}